

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DataTypeApplyFromText(char *buf,ImGuiDataType data_type,void *p_data,char *format)

{
  bool bVar1;
  int iVar2;
  int *local_88;
  int local_6c;
  char local_68 [4];
  int v32;
  char format_sanitized [32];
  undefined1 local_40 [8];
  ImGuiDataTypeTempStorage data_backup;
  ImGuiDataTypeInfo *type_info;
  char *format_local;
  void *p_data_local;
  char *pcStack_18;
  ImGuiDataType data_type_local;
  char *buf_local;
  
  pcStack_18 = buf;
  while (bVar1 = ImCharIsBlankA(*pcStack_18), bVar1) {
    pcStack_18 = pcStack_18 + 1;
  }
  if (*pcStack_18 == '\0') {
    buf_local._7_1_ = false;
  }
  else {
    data_backup.Data = (ImU8  [8])DataTypeGetInfo(data_type);
    memcpy(local_40,p_data,*(size_t *)data_backup.Data);
    if ((data_type == 8) || (data_type == 9)) {
      type_info = *(ImGuiDataTypeInfo **)((long)data_backup.Data + 0x18);
    }
    else {
      type_info = (ImGuiDataTypeInfo *)ImParseFormatSanitizeForScanning(format,local_68,0x20);
    }
    local_6c = 0;
    local_88 = (int *)p_data;
    if (*(ulong *)data_backup.Data < 4) {
      local_88 = &local_6c;
    }
    iVar2 = __isoc99_sscanf(pcStack_18,type_info,local_88);
    if (iVar2 < 1) {
      buf_local._7_1_ = false;
    }
    else {
      if (*(ulong *)data_backup.Data < 4) {
        if (data_type == 0) {
          iVar2 = ImClamp<int>(local_6c,-0x80,0x7f);
          *(char *)p_data = (char)iVar2;
        }
        else if (data_type == 1) {
          iVar2 = ImClamp<int>(local_6c,0,0xff);
          *(char *)p_data = (char)iVar2;
        }
        else if (data_type == 2) {
          iVar2 = ImClamp<int>(local_6c,-0x8000,0x7fff);
          *(short *)p_data = (short)iVar2;
        }
        else {
          if (data_type != 3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_widgets.cpp"
                          ,0x7fa,
                          "bool ImGui::DataTypeApplyFromText(const char *, ImGuiDataType, void *, const char *)"
                         );
          }
          iVar2 = ImClamp<int>(local_6c,0,0xffff);
          *(short *)p_data = (short)iVar2;
        }
      }
      iVar2 = memcmp(local_40,p_data,*(size_t *)data_backup.Data);
      buf_local._7_1_ = iVar2 != 0;
    }
  }
  return buf_local._7_1_;
}

Assistant:

bool ImGui::DataTypeApplyFromText(const char* buf, ImGuiDataType data_type, void* p_data, const char* format)
{
    while (ImCharIsBlankA(*buf))
        buf++;
    if (!buf[0])
        return false;

    // Copy the value in an opaque buffer so we can compare at the end of the function if it changed at all.
    const ImGuiDataTypeInfo* type_info = DataTypeGetInfo(data_type);
    ImGuiDataTypeTempStorage data_backup;
    memcpy(&data_backup, p_data, type_info->Size);

    // Sanitize format
    // For float/double we have to ignore format with precision (e.g. "%.2f") because sscanf doesn't take them in, so force them into %f and %lf
    char format_sanitized[32];
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        format = type_info->ScanFmt;
    else
        format = ImParseFormatSanitizeForScanning(format, format_sanitized, IM_ARRAYSIZE(format_sanitized));

    // Small types need a 32-bit buffer to receive the result from scanf()
    int v32 = 0;
    if (sscanf(buf, format, type_info->Size >= 4 ? p_data : &v32) < 1)
        return false;
    if (type_info->Size < 4)
    {
        if (data_type == ImGuiDataType_S8)
            *(ImS8*)p_data = (ImS8)ImClamp(v32, (int)IM_S8_MIN, (int)IM_S8_MAX);
        else if (data_type == ImGuiDataType_U8)
            *(ImU8*)p_data = (ImU8)ImClamp(v32, (int)IM_U8_MIN, (int)IM_U8_MAX);
        else if (data_type == ImGuiDataType_S16)
            *(ImS16*)p_data = (ImS16)ImClamp(v32, (int)IM_S16_MIN, (int)IM_S16_MAX);
        else if (data_type == ImGuiDataType_U16)
            *(ImU16*)p_data = (ImU16)ImClamp(v32, (int)IM_U16_MIN, (int)IM_U16_MAX);
        else
            IM_ASSERT(0);
    }

    return memcmp(&data_backup, p_data, type_info->Size) != 0;
}